

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCase *pTVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  size_t sVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool _missingAssertions;
  uint uVar8;
  long lVar9;
  long lVar10;
  pointer this_00;
  Counts diff;
  SectionInfo testCaseSection;
  SectionStats testCaseSectionStats;
  Counts local_138;
  size_t local_118;
  size_t sStack_110;
  SectionInfo local_108;
  RedirectedStreams local_b8;
  
  pTVar2 = this->m_activeTestCase;
  local_108.name._M_dataplus._M_p = (pointer)&local_108.name.field_2;
  pcVar3 = (pTVar2->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + (pTVar2->super_TestCaseInfo).name._M_string_length
            );
  paVar1 = &local_108.description.field_2;
  local_108.description._M_string_length = 0;
  local_108.description.field_2._M_local_buf[0] = '\0';
  local_108.lineInfo.file = (pTVar2->super_TestCaseInfo).lineInfo.file;
  local_108.lineInfo.line = (pTVar2->super_TestCaseInfo).lineInfo.line;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_108.description._M_dataplus._M_p = (pointer)paVar1;
  (*pIVar4->_vptr_IStreamingReporter[8])(pIVar4,&local_108);
  local_118 = (this->m_totals).assertions.passed;
  sStack_110 = (this->m_totals).assertions.failed;
  sVar5 = (this->m_totals).assertions.failedButOk;
  this->m_shouldReportUnexpected = true;
  local_b8.m_redirectedCout = (string *)(pTVar2->super_TestCaseInfo).lineInfo.file;
  local_b8.m_redirectedCerr = (string *)(pTVar2->super_TestCaseInfo).lineInfo.line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_b8.m_redirectedCout;
  (this->m_lastAssertionInfo).lineInfo.line = (size_t)local_b8.m_redirectedCerr;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  seedRng((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr);
  uVar8 = (*((this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
            _vptr_IStreamingReporter[2])();
  if ((uVar8 & 1) == 0) {
    lVar9 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  else {
    RedirectedStreams::RedirectedStreams(&local_b8,redirectedCout,redirectedCerr);
    lVar9 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams(&local_b8);
  }
  lVar10 = std::chrono::_V2::system_clock::now();
  local_138.passed = (this->m_totals).assertions.passed - local_118;
  local_138.failed = (this->m_totals).assertions.failed - sStack_110;
  local_138.failedButOk = (this->m_totals).assertions.failedButOk - sVar5;
  _missingAssertions = testForMissingAssertions(this,&local_138);
  (*this->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(this);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar6 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar7 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar6;
  if (pSVar7 != pSVar6) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar7);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar6;
  }
  SectionStats::SectionStats
            ((SectionStats *)&local_b8,&local_108,&local_138,
             (double)((ulong)(lVar10 - lVar9) / 1000) / 1000000.0,_missingAssertions);
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[0xb])(pIVar4,&local_b8);
  SectionStats::~SectionStats((SectionStats *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.description._M_dataplus._M_p,
                    CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                             local_108.description.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
    operator_delete(local_108.name._M_dataplus._M_p,local_108.name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }